

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_sse2.c
# Opt level: O2

void av1_calc_indices_dim1_sse2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  ulong uVar1;
  int j;
  long lVar2;
  int iVar3;
  longlong *plVar4;
  undefined4 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  short sVar10;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar11 [16];
  undefined1 auVar20 [16];
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar36 [16];
  short asStack_88 [2];
  undefined4 uStack_84;
  __m128i cents [8];
  short sVar19;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  
  uVar1 = 0;
  iVar3 = 0;
  if (0 < k) {
    iVar3 = k;
  }
  for (; (uint)(iVar3 * 2) != uVar1; uVar1 = uVar1 + 2) {
    auVar7 = pshuflw(ZEXT216(*(ushort *)((long)centroids + uVar1)),
                     ZEXT216(*(ushort *)((long)centroids + uVar1)),0);
    uVar5 = auVar7._0_4_;
    *(undefined4 *)(asStack_88 + uVar1 * 4) = uVar5;
    *(undefined4 *)((long)cents[-1] + uVar1 * 8 + 0xc) = uVar5;
    *(undefined4 *)(cents[0] + uVar1) = uVar5;
    *(undefined4 *)((long)cents[0] + uVar1 * 8 + 4) = uVar5;
  }
  lVar6 = 0;
  lVar8 = 0;
  for (iVar3 = 0; iVar3 < n; iVar3 = iVar3 + 8) {
    sVar10 = *data - asStack_88[0];
    sVar12 = data[1] - asStack_88[1];
    sVar13 = data[2] - (short)uStack_84;
    sVar14 = data[3] - uStack_84._2_2_;
    sVar15 = data[4] - (short)cents[0][0];
    sVar16 = data[5] - cents[0][0]._2_2_;
    sVar17 = data[6] - cents[0][0]._4_2_;
    sVar18 = data[7] - cents[0][0]._6_2_;
    sVar19 = -sVar10;
    sVar21 = -sVar12;
    sVar22 = -sVar13;
    sVar23 = -sVar14;
    sVar24 = -sVar15;
    sVar25 = -sVar16;
    sVar26 = -sVar17;
    sVar27 = -sVar18;
    auVar7._0_2_ = (ushort)(sVar19 < sVar10) * sVar10 | (ushort)(sVar19 >= sVar10) * sVar19;
    auVar7._2_2_ = (ushort)(sVar21 < sVar12) * sVar12 | (ushort)(sVar21 >= sVar12) * sVar21;
    auVar7._4_2_ = (ushort)(sVar22 < sVar13) * sVar13 | (ushort)(sVar22 >= sVar13) * sVar22;
    auVar7._6_2_ = (ushort)(sVar23 < sVar14) * sVar14 | (ushort)(sVar23 >= sVar14) * sVar23;
    auVar7._8_2_ = (ushort)(sVar24 < sVar15) * sVar15 | (ushort)(sVar24 >= sVar15) * sVar24;
    auVar7._10_2_ = (ushort)(sVar25 < sVar16) * sVar16 | (ushort)(sVar25 >= sVar16) * sVar25;
    auVar7._12_2_ = (ushort)(sVar26 < sVar17) * sVar17 | (ushort)(sVar26 >= sVar17) * sVar26;
    auVar7._14_2_ = (ushort)(sVar27 < sVar18) * sVar18 | (ushort)(sVar27 >= sVar18) * sVar27;
    auVar11 = (undefined1  [16])0x0;
    plVar4 = cents[0] + 1;
    for (lVar2 = 1; lVar2 < k; lVar2 = lVar2 + 1) {
      sVar10 = *data - (short)*plVar4;
      sVar12 = data[1] - *(short *)((long)plVar4 + 2);
      sVar13 = data[2] - *(short *)((long)plVar4 + 4);
      sVar14 = data[3] - *(short *)((long)plVar4 + 6);
      sVar15 = data[4] - *(short *)(plVar4 + 1);
      sVar16 = data[5] - *(short *)((long)plVar4 + 10);
      sVar17 = data[6] - *(short *)((long)plVar4 + 0xc);
      sVar18 = data[7] - *(short *)((long)plVar4 + 0xe);
      sVar19 = -sVar10;
      sVar21 = -sVar12;
      sVar22 = -sVar13;
      sVar23 = -sVar14;
      sVar24 = -sVar15;
      sVar25 = -sVar16;
      sVar26 = -sVar17;
      sVar27 = -sVar18;
      uVar28 = (ushort)(sVar19 < sVar10) * sVar10 | (ushort)(sVar19 >= sVar10) * sVar19;
      uVar29 = (ushort)(sVar21 < sVar12) * sVar12 | (ushort)(sVar21 >= sVar12) * sVar21;
      uVar30 = (ushort)(sVar22 < sVar13) * sVar13 | (ushort)(sVar22 >= sVar13) * sVar22;
      uVar31 = (ushort)(sVar23 < sVar14) * sVar14 | (ushort)(sVar23 >= sVar14) * sVar23;
      uVar32 = (ushort)(sVar24 < sVar15) * sVar15 | (ushort)(sVar24 >= sVar15) * sVar24;
      uVar33 = (ushort)(sVar25 < sVar16) * sVar16 | (ushort)(sVar25 >= sVar16) * sVar25;
      uVar34 = (ushort)(sVar26 < sVar17) * sVar17 | (ushort)(sVar26 >= sVar17) * sVar26;
      uVar35 = (ushort)(sVar27 < sVar18) * sVar18 | (ushort)(sVar27 >= sVar18) * sVar27;
      sVar19 = auVar7._0_2_;
      auVar20._0_2_ = ((short)uVar28 < sVar19) * uVar28 | (ushort)((short)uVar28 >= sVar19) * sVar19
      ;
      sVar21 = auVar7._2_2_;
      auVar20._2_2_ = ((short)uVar29 < sVar21) * uVar29 | (ushort)((short)uVar29 >= sVar21) * sVar21
      ;
      sVar22 = auVar7._4_2_;
      auVar20._4_2_ = ((short)uVar30 < sVar22) * uVar30 | (ushort)((short)uVar30 >= sVar22) * sVar22
      ;
      sVar23 = auVar7._6_2_;
      auVar20._6_2_ = ((short)uVar31 < sVar23) * uVar31 | (ushort)((short)uVar31 >= sVar23) * sVar23
      ;
      sVar24 = auVar7._8_2_;
      auVar20._8_2_ = ((short)uVar32 < sVar24) * uVar32 | (ushort)((short)uVar32 >= sVar24) * sVar24
      ;
      sVar25 = auVar7._10_2_;
      auVar20._10_2_ =
           ((short)uVar33 < sVar25) * uVar33 | (ushort)((short)uVar33 >= sVar25) * sVar25;
      sVar26 = auVar7._12_2_;
      sVar27 = auVar7._14_2_;
      auVar20._12_2_ =
           ((short)uVar34 < sVar26) * uVar34 | (ushort)((short)uVar34 >= sVar26) * sVar26;
      auVar20._14_2_ =
           ((short)uVar35 < sVar27) * uVar35 | (ushort)((short)uVar35 >= sVar27) * sVar27;
      auVar7 = pshuflw(ZEXT416((uint)lVar2),ZEXT416((uint)lVar2),0);
      auVar36._0_4_ = auVar7._0_4_;
      auVar36._4_4_ = auVar36._0_4_;
      auVar36._8_4_ = auVar36._0_4_;
      auVar36._12_4_ = auVar36._0_4_;
      auVar9._0_2_ = -(ushort)((short)uVar28 < sVar19);
      auVar9._2_2_ = -(ushort)((short)uVar29 < sVar21);
      auVar9._4_2_ = -(ushort)((short)uVar30 < sVar22);
      auVar9._6_2_ = -(ushort)((short)uVar31 < sVar23);
      auVar9._8_2_ = -(ushort)((short)uVar32 < sVar24);
      auVar9._10_2_ = -(ushort)((short)uVar33 < sVar25);
      auVar9._12_2_ = -(ushort)((short)uVar34 < sVar26);
      auVar9._14_2_ = -(ushort)((short)uVar35 < sVar27);
      auVar11 = auVar9 & auVar36 | ~auVar9 & auVar11;
      plVar4 = plVar4 + 2;
      auVar7 = auVar20;
    }
    if (total_dist != (int64_t *)0x0) {
      auVar7 = pmaddwd(auVar7,auVar7);
      lVar6 = lVar6 + (auVar7._0_8_ & 0xffffffff) + (ulong)auVar7._8_4_;
      lVar8 = lVar8 + (ulong)auVar7._4_4_ + (ulong)auVar7._12_4_;
    }
    sVar19 = auVar11._0_2_;
    sVar21 = auVar11._2_2_;
    sVar22 = auVar11._4_2_;
    sVar23 = auVar11._6_2_;
    sVar24 = auVar11._8_2_;
    sVar25 = auVar11._10_2_;
    sVar26 = auVar11._12_2_;
    sVar27 = auVar11._14_2_;
    *(ulong *)indices =
         CONCAT17((0 < sVar27) * (sVar27 < 0x100) * auVar11[0xe] - (0xff < sVar27),
                  CONCAT16((0 < sVar26) * (sVar26 < 0x100) * auVar11[0xc] - (0xff < sVar26),
                           CONCAT15((0 < sVar25) * (sVar25 < 0x100) * auVar11[10] - (0xff < sVar25),
                                    CONCAT14((0 < sVar24) * (sVar24 < 0x100) * auVar11[8] -
                                             (0xff < sVar24),
                                             CONCAT13((0 < sVar23) * (sVar23 < 0x100) * auVar11[6] -
                                                      (0xff < sVar23),
                                                      CONCAT12((0 < sVar22) * (sVar22 < 0x100) *
                                                               auVar11[4] - (0xff < sVar22),
                                                               CONCAT11((0 < sVar21) *
                                                                        (sVar21 < 0x100) *
                                                                        auVar11[2] - (0xff < sVar21)
                                                                        ,(0 < sVar19) *
                                                                         (sVar19 < 0x100) *
                                                                         auVar11[0] -
                                                                         (0xff < sVar19))))))));
    indices = indices + 8;
    data = data + 8;
  }
  if (total_dist != (int64_t *)0x0) {
    *total_dist = lVar8 + lVar6;
  }
  return;
}

Assistant:

void av1_calc_indices_dim1_sse2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m128i v_zero = _mm_setzero_si128();
  __m128i sum = _mm_setzero_si128();
  __m128i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    cents[j] = _mm_set1_epi16(centroids[j]);
  }

  for (int i = 0; i < n; i += 8) {
    const __m128i in = _mm_loadu_si128((__m128i *)data);
    __m128i ind = _mm_setzero_si128();
    // Compute the distance to the first centroid.
    __m128i d1 = _mm_sub_epi16(in, cents[0]);
    __m128i d2 = _mm_sub_epi16(cents[0], in);
    __m128i dist_min = _mm_max_epi16(d1, d2);

    for (int j = 1; j < k; ++j) {
      // Compute the distance to the centroid.
      d1 = _mm_sub_epi16(in, cents[j]);
      d2 = _mm_sub_epi16(cents[j], in);
      const __m128i dist = _mm_max_epi16(d1, d2);
      // Compare to the minimal one.
      const __m128i cmp = _mm_cmpgt_epi16(dist_min, dist);
      dist_min = _mm_min_epi16(dist_min, dist);
      const __m128i ind1 = _mm_set1_epi16(j);
      ind = _mm_or_si128(_mm_andnot_si128(cmp, ind), _mm_and_si128(cmp, ind1));
    }
    if (total_dist) {
      // Square, convert to 32 bit and add together.
      dist_min = _mm_madd_epi16(dist_min, dist_min);
      // Convert to 64 bit and add to sum.
      const __m128i dist1 = _mm_unpacklo_epi32(dist_min, v_zero);
      const __m128i dist2 = _mm_unpackhi_epi32(dist_min, v_zero);
      sum = _mm_add_epi64(sum, dist1);
      sum = _mm_add_epi64(sum, dist2);
    }
    __m128i p2 = _mm_packus_epi16(ind, v_zero);
    _mm_storel_epi64((__m128i *)indices, p2);
    indices += 8;
    data += 8;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_sse2(sum);
  }
}